

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.cpp
# Opt level: O1

bool __thiscall configFileReader::isEOF(configFileReader *this)

{
  char cVar1;
  typeOfSeparator tVar2;
  int iVar3;
  bool bVar4;
  
  if (this->readFromString == true) {
    bVar4 = (this->text)._M_string_length <= (ulong)this->index;
  }
  else {
    openFile(this);
    bVar4 = true;
    if (*(int *)(this->configFile + *(long *)(*(long *)this->configFile + -0x18) + 0x20) == 0) {
      if (*(int *)(this->configFile + *(long *)(*(long *)this->configFile + -0x18) + 0x20) == 0) {
        iVar3 = 1;
        do {
          cVar1 = peekNextChar(this);
          tVar2 = isSeparator(this,cVar1);
          if (tVar2 != space) break;
          skipNextChar(this);
          cVar1 = peekNextChar(this);
          tVar2 = isSeparator(this,cVar1);
          if ((tVar2 != space) && (cVar1 = peekNextChar(this), cVar1 != -1)) {
            do {
              std::istream::unget();
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
            return false;
          }
          iVar3 = iVar3 + 1;
        } while (*(int *)(this->configFile + *(long *)(*(long *)this->configFile + -0x18) + 0x20) ==
                 0);
      }
      cVar1 = peekNextChar(this);
      bVar4 = cVar1 == -1;
    }
  }
  return bVar4;
}

Assistant:

bool configFileReader::isEOF() {
    if (readFromString) {
        return index >= text.length();
    } else {
        openFile();
        if ((configFile->rdstate() && ios::eofbit) || (configFile->rdstate() && ios::failbit)) {
            return true;
        }
        int count = 0;
        while (!(configFile->rdstate() && ios::eofbit) && !(configFile->rdstate() && ios::failbit) &&
               isSeparator(peekNextChar()) == typeOfSeparator::space) {
            skipNextChar();
            count++;
            if (isSeparator(peekNextChar()) != typeOfSeparator::space && peekNextChar() != -1) {
                for (int i = 0; i < count; i++) {
                    configFile->unget();
                }
                return false;
            }
        }
        if (peekNextChar() != -1)
            return false;
        return true;
    }
}